

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_from_socket(netaddr *dst,netaddr_socket *src)

{
  undefined8 uVar1;
  int iVar2;
  uint8_t uVar3;
  
  dst->_addr[0] = '\0';
  dst->_addr[1] = '\0';
  dst->_addr[2] = '\0';
  dst->_addr[3] = '\0';
  dst->_addr[4] = '\0';
  dst->_addr[5] = '\0';
  dst->_addr[6] = '\0';
  dst->_addr[7] = '\0';
  dst->_addr[8] = '\0';
  dst->_addr[9] = '\0';
  dst->_addr[10] = '\0';
  dst->_addr[0xb] = '\0';
  dst->_addr[0xc] = '\0';
  dst->_addr[0xd] = '\0';
  dst->_addr[0xe] = '\0';
  dst->_addr[0xf] = '\0';
  if ((src->v4).sin_family == 10) {
    uVar1 = *(undefined8 *)((long)&(src->v6).sin6_addr.__in6_u + 8);
    *(undefined8 *)dst->_addr = *(undefined8 *)(src->v4).sin_zero;
    *(undefined8 *)(dst->_addr + 8) = uVar1;
    uVar3 = 0x80;
  }
  else {
    if ((src->v4).sin_family != 2) {
      uVar3 = '\0';
      iVar2 = -1;
      goto LAB_00109417;
    }
    *(in_addr_t *)dst->_addr = (src->v4).sin_addr.s_addr;
    uVar3 = ' ';
  }
  dst->_prefix_len = uVar3;
  uVar3 = *(uint8_t *)src;
  iVar2 = 0;
LAB_00109417:
  dst->_type = uVar3;
  return iVar2;
}

Assistant:

int
netaddr_from_socket(struct netaddr *dst, const union netaddr_socket *src) {
  memset(dst->_addr, 0, sizeof(dst->_addr));
  if (src->std.sa_family == AF_INET) {
    /* ipv4 */
    memcpy(dst->_addr, &src->v4.sin_addr, 4);
    dst->_prefix_len = 32;
  }
  else if (src->std.sa_family == AF_INET6) {
    /* ipv6 */
    memcpy(dst->_addr, &src->v6.sin6_addr, 16);
    dst->_prefix_len = 128;
  }
  else {
    /* unknown address type */
    dst->_type = AF_UNSPEC;
    return -1;
  }
  dst->_type = (uint8_t)src->std.sa_family;
  return 0;
}